

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom.cpp
# Opt level: O3

Vector3d *
ear::cart(Vector3d *__return_storage_ptr__,double azimuth,double elevation,double distance)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar1 = sin(azimuth * -0.017453292519943295);
  dVar2 = elevation * 0.017453292519943295;
  dVar3 = cos(dVar2);
  dVar4 = cos(azimuth * -0.017453292519943295);
  dVar5 = cos(dVar2);
  dVar2 = sin(dVar2);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[0] = distance * dVar3 * dVar1;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[1] = distance * dVar5 * dVar4;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[2] = dVar2 * distance;
  return __return_storage_ptr__;
}

Assistant:

Eigen::Vector3d cart(double azimuth, double elevation, double distance) {
    return Eigen::Vector3d(
        sin(radians(-azimuth)) * cos(radians(elevation)) * distance,
        cos(radians(-azimuth)) * cos(radians(elevation)) * distance,
        sin(radians(elevation)) * distance);
  }